

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

TOK __thiscall Lexer::yylex0(Lexer *this)

{
  string *__lhs;
  char *pcVar1;
  int iVar2;
  TOK TVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  string local_50 [32];
  
  __lhs = &this->yytext;
LAB_0010c723:
  do {
    iVar2 = isspace((int)this->yychar);
    if (iVar2 != 0) goto LAB_0010c731;
    this->yytokenlineno = this->yylineno;
    (this->yytext)._M_string_length = 0;
    *(this->yytext)._M_dataplus._M_p = '\0';
    cVar6 = this->yychar;
    iVar2 = (int)cVar6;
    if (iVar2 == 0) {
      return T_EOF_SYMBOL;
    }
    cVar4 = (char)__lhs;
    std::__cxx11::string::push_back(cVar4);
    yyinp(this);
    cVar5 = this->yychar;
    if (cVar5 == '{' && cVar6 == '%') {
      yyinp(this);
      skip(this,'{','{','}');
      std::__cxx11::string::string(local_50,(string *)__lhs,2,(this->yytext)._M_string_length - 4);
      std::__cxx11::string::operator=((string *)__lhs,local_50);
      std::__cxx11::string::~string(local_50);
      return T_TEXT;
    }
    if (cVar6 == '%') {
      iVar2 = isalpha((int)cVar5);
      if (iVar2 == 0) {
        iVar2 = 0x25;
        bVar7 = false;
LAB_0010ca3c:
        iVar2 = isalpha(iVar2);
        if ((!bVar7) && (iVar2 == 0)) {
          return T_ERROR;
        }
        while ((iVar2 = isalnum((int)cVar5), cVar5 == '_' || (iVar2 != 0))) {
          std::__cxx11::string::push_back(cVar4);
          yyinp(this);
          cVar5 = this->yychar;
        }
        return T_IDENTIFIER;
      }
      while (((iVar2 = isalnum((int)cVar5), iVar2 != 0 || (cVar5 == '_')) || (cVar5 == '-'))) {
        std::__cxx11::string::push_back(cVar4);
        yyinp(this);
        cVar5 = this->yychar;
      }
      bVar7 = std::operator==(__lhs,"%extern");
      if (bVar7) {
        TVar3 = T_EXTERN;
      }
      else {
        bVar7 = std::operator==(__lhs,"%token-type");
        if (bVar7) {
          TVar3 = T_TOKEN_TYPE;
        }
        else {
          bVar7 = std::operator==(__lhs,"%token");
          if (bVar7) {
            TVar3 = T_TOKEN;
          }
          else {
            bVar7 = std::operator==(__lhs,"%class");
            if (bVar7) {
              TVar3 = T_CLASS;
            }
            else {
              bVar7 = std::operator==(__lhs,"%extends");
              TVar3 = T_ERROR;
              if (bVar7) {
                TVar3 = T_EXTENDS;
              }
            }
          }
        }
      }
switchD_0010c7a5_caseD_3a:
      return TVar3;
    }
    TVar3 = T_COLON;
    switch(cVar6) {
    case '\'':
      std::__cxx11::string::operator=((string *)__lhs,'\'');
      do {
        cVar6 = this->yychar;
        if (cVar6 == '\\') {
          std::__cxx11::string::push_back(cVar4);
          yyinp(this);
          if (this->yychar == '\0') {
            return T_ERROR;
          }
          if (this->yychar == '\n') {
            return T_ERROR;
          }
        }
        else {
          if (cVar6 == '\0') {
            return T_ERROR;
          }
          if (cVar6 == '\n') {
            return T_ERROR;
          }
          if (cVar6 == '\'') {
            std::__cxx11::string::push_back(cVar4);
            yyinp(this);
            return T_CHAR_LITERAL;
          }
        }
        std::__cxx11::string::push_back(cVar4);
        yyinp(this);
      } while( true );
    case '(':
      pcVar1 = (this->yypos)._M_current;
      if (pcVar1[-2] != '(') {
        __assert_fail("*pos == \'(\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/lexer.cc"
                      ,99,"TOK Lexer::yylex0()");
      }
      if (pcVar1 + -2 != (this->yycode)._M_dataplus._M_p) {
        cVar6 = pcVar1[-3];
        iVar2 = isalnum((int)cVar6);
        if ((cVar6 != 0x5f) && (iVar2 == 0)) {
          return T_LPAREN;
        }
        skip(this,'(','(',')');
        std::__cxx11::string::string(local_50,(string *)__lhs,1,(this->yytext)._M_string_length - 2)
        ;
        std::__cxx11::string::operator=((string *)__lhs,local_50);
        std::__cxx11::string::~string(local_50);
        return T_EXTRA;
      }
      return T_LPAREN;
    case ')':
      return T_RPAREN;
    case '*':
      return T_STAR;
    case '+':
      return T_PLUS;
    case ',':
      return T_COMMA;
    case '/':
      if (cVar5 == '*') goto LAB_0010c7dc;
      if (cVar5 != '/') {
        return T_SLASH;
      }
      while ((cVar5 != '\0' && (cVar5 != '\n'))) {
        yyinp(this);
        cVar5 = this->yychar;
      }
      break;
    case ':':
      goto switchD_0010c7a5_caseD_3a;
    case ';':
      return T_SEMICOLON;
    case '?':
      return T_QUESTION;
    default:
      if (cVar6 == '#') {
        return T_POUND;
      }
      if (cVar6 == '{') {
        skip(this,'{','{','}');
        return T_CODE;
      }
      if (cVar6 == '|') {
        return T_BAR;
      }
    case '-':
    case '.':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case '<':
    case '=':
    case '>':
      bVar7 = cVar6 == '_';
      goto LAB_0010ca3c;
    }
  } while( true );
LAB_0010c7dc:
  yyinp(this);
  cVar6 = this->yychar;
  do {
    if (cVar6 == '\0') goto LAB_0010c723;
    yyinp(this);
    bVar7 = cVar6 != '*';
    cVar6 = this->yychar;
  } while (this->yychar != '/' || bVar7);
LAB_0010c731:
  yyinp(this);
  goto LAB_0010c723;
}

Assistant:

TOK Lexer::yylex0() {
again:
  while (isspace(yychar)) yyinp();
  yytokenlineno = yylineno;
  yytext.clear();
  if (!yychar) return T_EOF_SYMBOL;
  auto ch = yychar;
  yytext += ch;
  yyinp();
  if (ch == '%' && yychar == '{') {
    yyinp();
    skip('{', '{', '}');
    yytext = std::string(yytext, 2, yytext.length() - 4);
    return T_TEXT;
  }
  if (ch == '%' && isalpha(yychar)) {
    while (isalnum(yychar) || yychar == '_' || yychar == '-') {
      yytext += yychar;
      yyinp();
    }
    if (yytext == "%extern") return T_EXTERN;
    if (yytext == "%token-type") return T_TOKEN_TYPE;
    if (yytext == "%token") return T_TOKEN;
    if (yytext == "%class") return T_CLASS;
    if (yytext == "%extends") return T_EXTENDS;
    return T_ERROR;
  }
  if (ch == '/') {
    if (yychar == '/') {
      for (; yychar; yyinp()) {
        if (yychar == '\n') break;
      }
      goto again;
    }
    if (yychar == '*') {
      yyinp();
      while (yychar) {
        auto ch = yychar;
        yyinp();
        if (ch == '*' && yychar == '/') {
          yyinp();
          break;
        }
      }
      goto again;
    }
    return T_SLASH;
  }
  if (ch == '\'') {
    yytext = ch;
    while (yychar && yychar != '\'' && yychar != '\n') {
      if (yychar == '\\') {
        yytext += yychar;
        yyinp();
        if (!yychar || yychar == '\n') break;
      }
      yytext += yychar;
      yyinp();
    }
    if (yychar != '\'') return T_ERROR;
    yytext += yychar;
    yyinp();
    return T_CHAR_LITERAL;
  }
  if (ch == '{') {
    skip(ch, '{', '}');
    return T_CODE;
  }
  if (ch == '(') {
    auto pos = yypos - 2;
    assert(*pos == '(');
    if (pos != yycode.cbegin() && (isalnum(pos[-1]) || pos[-1] == '_')) {
      skip(ch, '(', ')');
      yytext = std::string(yytext, 1, yytext.length() - 2);
      return T_EXTRA;
    }
    return T_LPAREN;
  }
  if (ch == '#') return T_POUND;
  if (ch == ')') return T_RPAREN;
  if (ch == '*') return T_STAR;
  if (ch == '+') return T_PLUS;
  if (ch == ',') return T_COMMA;
  if (ch == ':') return T_COLON;
  if (ch == ';') return T_SEMICOLON;
  if (ch == '?') return T_QUESTION;
  if (ch == '|') return T_BAR;
  if (isalpha(ch) || ch == '_') {
    while (isalnum(yychar) || yychar == '_') {
      yytext += yychar;
      yyinp();
    }
    return T_IDENTIFIER;
  }
  return T_ERROR;
}